

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relivedb.cpp
# Opt level: O0

void __thiscall relive::ReLiveDB::setPlayed(ReLiveDB *this,Stream *stream)

{
  long in_RSI;
  lock_guard<std::recursive_mutex> *in_RDI;
  Stream *in_stack_00000008;
  storage_t<_86c824a_> *in_stack_00000010;
  lock_guard<std::recursive_mutex> lock;
  mutex_type *in_stack_ffffffffffffffc8;
  
  if ((*(uint *)(in_RSI + 0xd8) & 2) == 0) {
    std::lock_guard<std::recursive_mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffc8);
    *(uint *)(in_RSI + 0xd8) = *(uint *)(in_RSI + 0xd8) | 2;
    storage_abi_cxx11_();
    sqlite_orm::internal::storage_t<$86c824a$>::update<relive::Stream>
              (in_stack_00000010,in_stack_00000008);
    std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1f1b3a)
    ;
  }
  return;
}

Assistant:

void ReLiveDB::setPlayed(Stream& stream)
{
    if (!(stream._flags & Stream::ePlayed)) {
        std::lock_guard<Mutex> lock{_mutex};
        stream._flags |= Stream::ePlayed;
        storage().update(stream);
    }
}